

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

int ED::RetrieveChainNos(Chain *chains,int root,int *chainNos)

{
  int local_24;
  int count;
  int *chainNos_local;
  int root_local;
  Chain *chains_local;
  
  local_24 = 0;
  chainNos_local._4_4_ = root;
  while (chainNos_local._4_4_ != -1) {
    chainNos[local_24] = chainNos_local._4_4_;
    local_24 = local_24 + 1;
    if (chains[chainNos_local._4_4_].children[0] == -1) {
      chainNos_local._4_4_ = chains[chainNos_local._4_4_].children[1];
    }
    else {
      chainNos_local._4_4_ = chains[chainNos_local._4_4_].children[0];
    }
  }
  return local_24;
}

Assistant:

int ED::RetrieveChainNos(Chain * chains, int root, int chainNos[])
{
	int count = 0;

	while (root != -1) {
		chainNos[count] = root;
		count++;

		if (chains[root].children[0] != -1) root = chains[root].children[0];
		else                                root = chains[root].children[1];
	} //end-while

	return count;
}